

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqCommsSS::initializeConnectionToBroker
          (ZmqCommsSS *this,socket_t *brokerConnection)

{
  string_view name;
  string_view string2;
  string_view string1;
  string_view string3;
  socket_base *this_00;
  char *pcVar1;
  size_type sVar2;
  vector<char,_std::allocator<char>_> *this_01;
  size_type n;
  socket_base *psVar3;
  sockaddr *__addr;
  socket_base *in_RSI;
  long in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  int __flags;
  void *in_R8;
  socklen_t in_R9D;
  ActionMessage cmessage;
  vector<char,_std::allocator<char>_> buffer;
  error_t *ze;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  ActionMessage *this_03;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffd08;
  vector<char,_std::allocator<char>_> *this_04;
  ActionMessage *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 uVar4;
  action_t in_stack_fffffffffffffd1c;
  undefined4 uVar5;
  undefined7 in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd27;
  undefined4 in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffd34;
  const_buffer local_290 [3];
  __sv_type local_260;
  __sv_type local_250;
  __sv_type local_240;
  __sv_type local_230;
  undefined4 local_21c;
  NetworkCommsInterface *in_stack_fffffffffffffdf8;
  vector<char,_std::allocator<char>_> local_168 [12];
  undefined1 local_40 [36];
  undefined4 local_1c;
  socket_base *local_18;
  int local_4;
  
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0xd0);
  local_18 = in_RSI;
  pcVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3f85d2);
  sVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (this_02);
  zmq::detail::socket_base::setsockopt(in_RSI,5,(int)pcVar1,(int)sVar2,in_R8,in_R9D);
  local_1c = 500;
  zmq::detail::socket_base::setsockopt<int>
            ((socket_base *)in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc,(int *)0x3f861d);
  this_00 = local_18;
  psVar3 = local_18;
  gmlc::networking::makePortAddress((string *)this_02,in_stack_fffffffffffffd34);
  zmq::detail::socket_base::connect(this_00,(int)local_40,__addr,(socklen_t)psVar3);
  std::__cxx11::string::~string(in_stack_fffffffffffffd00);
  CLI::std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)0x3f89e8);
  ActionMessage::ActionMessage
            ((ActionMessage *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd1c);
  local_21c = 299;
  local_230 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  name._M_len._4_4_ = in_stack_fffffffffffffcfc;
  name._M_len._0_4_ = in_stack_fffffffffffffcf8;
  name._M_str = (char *)in_stack_fffffffffffffd00;
  ActionMessage::name((ActionMessage *)0x3f8a45,name);
  local_240 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  local_250 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  NetworkCommsInterface::getAddress_abi_cxx11_(in_stack_fffffffffffffdf8);
  local_260 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffd00);
  __flags = (int)local_250._M_str;
  string1._M_len._4_4_ = in_stack_fffffffffffffd1c;
  string1._M_len._0_4_ = in_stack_fffffffffffffd18;
  string1._M_str._0_7_ = in_stack_fffffffffffffd20;
  string1._M_str._7_1_ = in_stack_fffffffffffffd27;
  string2._M_str = (char *)in_stack_fffffffffffffd10;
  string2._M_len = (size_t)in_stack_fffffffffffffd08;
  string3._M_len._4_4_ = in_stack_fffffffffffffd34;
  string3._M_len._0_4_ = in_stack_fffffffffffffd30;
  string3._M_str = (char *)this_02;
  this_03 = (ActionMessage *)local_260._M_str;
  ActionMessage::setStringData((ActionMessage *)local_260._M_str,string1,string2,string3);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_03);
  ActionMessage::to_vector(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  uVar4 = SUB84(local_18,0);
  uVar5 = (undefined4)((ulong)local_18 >> 0x20);
  this_04 = local_168;
  this_01 = (vector<char,_std::allocator<char>_> *)
            std::vector<char,_std::allocator<char>_>::data
                      ((vector<char,_std::allocator<char>_> *)0x3f8b3a);
  n = CLI::std::vector<char,_std::allocator<char>_>::size(this_04);
  zmq::const_buffer::const_buffer(local_290,this_01,n);
  zmq::detail::socket_base::send
            ((socket_base *)CONCAT44(uVar5,uVar4),(int)local_290[0]._data,(void *)local_290[0]._size
             ,1,__flags);
  local_4 = 0;
  ActionMessage::~ActionMessage(this_03);
  CLI::std::vector<char,_std::allocator<char>_>::~vector(this_01);
  return local_4;
}

Assistant:

int ZmqCommsSS::initializeConnectionToBroker(zmq::socket_t& brokerConnection)
{
    brokerConnection.setsockopt(ZMQ_IDENTITY, name.c_str(), name.size());
    brokerConnection.setsockopt(ZMQ_LINGER, 500);
    try {
        brokerConnection.connect(
            gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort));
    }
    catch (zmq::error_t& ze) {
        logError(std::string("unable to connect with broker at ") +
                 gmlc::networking::makePortAddress(brokerTargetAddress, brokerPort + 1) + ":(" +
                 name + ")" + ze.what());
        setTxStatus(ConnectionStatus::ERRORED);
        return -1;
    }
    std::vector<char> buffer;
    // generate a local protocol connection string to send it's identity
    ActionMessage cmessage(CMD_PROTOCOL);
    cmessage.messageID = CONNECTION_INFORMATION;
    cmessage.name(name);
    cmessage.setStringData(brokerName, brokerInitString, getAddress());
    cmessage.to_vector(buffer);
    brokerConnection.send(zmq::const_buffer(buffer.data(), buffer.size()),
                          zmq::send_flags::dontwait);
    return 0;
}